

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfstrmatrix.cpp
# Opt level: O2

int __thiscall
TPZSFStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>::ClassId
          (TPZSFStructMatrix<double,_TPZStructMatrixTBBFlow<double>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZSFStructMatrix",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZStructMatrixT<double>::ClassId(&this->super_TPZStructMatrixT<double>);
  iVar3 = TPZStructMatrixTBBFlow<double>::ClassId
                    ((TPZStructMatrixTBBFlow<double> *)
                     &(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.field_0xa0);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZSFStructMatrix<TVar,TPar>::ClassId() const{
    return Hash("TPZSFStructMatrix") ^
        TPZStructMatrixT<TVar>::ClassId() << 1 ^
        TPar::ClassId() << 2;
}